

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void collect_args_and_func_types(c2m_ctx_t c2m_ctx,func_type *func_type)

{
  gen_ctx_conflict *pgVar1;
  VARR_MIR_var_t *pVVar2;
  VARR_MIR_type_t *pVVar3;
  long lVar4;
  uint uVar5;
  MIR_type_t MVar6;
  int n_qwords;
  MIR_type_t MVar7;
  ulong uVar8;
  MIR_type_t *pMVar9;
  mir_size_t mVar10;
  node_t pnVar11;
  c2m_ctx_t pcVar12;
  MIR_var_t *pMVar13;
  char *suffix;
  MIR_type_t promoted_type;
  type *ptVar14;
  c2m_ctx_t c2m_ctx_00;
  ulong uVar15;
  char *pcVar16;
  size_t sVar17;
  node_t pnVar18;
  target_arg_info_t arg_info;
  target_arg_info_t local_50;
  gen_ctx_conflict *local_48;
  MIR_type_t local_40 [2];
  c2m_ctx_t local_38;
  
  pgVar1 = c2m_ctx->gen_ctx;
  pVVar2 = (pgVar1->proto_info).arg_vars;
  local_48 = pgVar1;
  if ((pVVar2 == (VARR_MIR_var_t *)0x0) || (pVVar2->varr == (MIR_var_t *)0x0)) {
LAB_0019ca19:
    collect_args_and_func_types_cold_6();
    c2m_ctx_00 = c2m_ctx;
LAB_0019ca1e:
    collect_args_and_func_types_cold_5();
  }
  else {
    pnVar18 = (func_type->param_list->u).ops.head;
    pVVar2->els_num = 0;
    pVVar3 = (pgVar1->proto_info).ret_types;
    c2m_ctx_00 = c2m_ctx;
    if ((pVVar3 == (VARR_MIR_type_t *)0x0) || (pVVar3->varr == (MIR_type_t *)0x0))
    goto LAB_0019ca1e;
    pVVar3->els_num = 0;
    (pgVar1->proto_info).res_ref_p = 0;
    local_50.n_iregs = 0;
    local_50.n_fregs = 0;
    set_type_layout(c2m_ctx,func_type->ret_type);
    func_type = (func_type *)func_type->ret_type;
    pVVar3 = (pgVar1->proto_info).ret_types;
    pVVar2 = (pgVar1->proto_info).arg_vars;
    pcVar12 = c2m_ctx;
    local_38 = c2m_ctx;
    if ((((type *)func_type)->mode == TM_BASIC) && ((((type *)func_type)->u).basic_type == TP_VOID))
    {
LAB_0019c865:
      if ((pnVar18 != (node_t)0x0) &&
         (((pnVar18->code != N_TYPE ||
           (lVar4 = *(long *)((long)pnVar18->attr + 0x18), *(int *)(lVar4 + 0x18) != 1)) ||
          (*(int *)(lVar4 + 0x30) != 1)))) {
        do {
          if (pnVar18->code == N_TYPE) {
            ptVar14 = *(type **)((long)pnVar18->attr + 0x18);
            pcVar16 = "p";
          }
          else {
            pnVar11 = (pnVar18->u).ops.head;
            if (pnVar11 != (node_t)0x0) {
              pnVar11 = (pnVar11->op_link).next;
            }
            if (((pnVar18->code != N_SPEC_DECL) || (pnVar11 == (node_t)0x0)) ||
               (pnVar11->code != N_DECL)) goto LAB_0019c9f5;
            ptVar14 = *(type **)((long)pnVar18->attr + 0x40);
            pcVar16 = get_param_name(pcVar12,ptVar14,(((pnVar11->u).ops.head)->u).s.s);
          }
          pVVar2 = (local_48->proto_info).arg_vars;
          n_qwords = process_aggregate_arg(pcVar12,ptVar14,&local_50,local_40);
          if ((ptVar14->mode & ~TM_BASIC) == TM_STRUCT) {
            MVar7 = get_blk_type(n_qwords,local_40);
            pcVar12 = (c2m_ctx_t)raw_type_size(pcVar12,ptVar14);
            uVar15 = (ulong)ptVar14->align;
            if (uVar15 != 0) {
              uVar8 = (long)pcVar12->env[0].__jmpbuf + (uVar15 - 0x11);
              pcVar12 = (c2m_ctx_t)(uVar8 - uVar8 % uVar15);
            }
          }
          else {
            MVar7 = get_mir_type(pcVar12,ptVar14);
            if ((MVar7 & 0x1e) == MIR_T_F) {
              local_50.n_fregs = local_50.n_fregs + 1;
            }
            else if (MVar7 != MIR_T_LD) {
              local_50.n_iregs = local_50.n_iregs + 1;
            }
          }
          if (pVVar2->varr == (MIR_var_t *)0x0) {
            collect_args_and_func_types_cold_4();
LAB_0019c9f5:
            __assert_fail("p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2c94,"void collect_args_and_func_types(c2m_ctx_t, struct func_type *)")
            ;
          }
          uVar15 = pVVar2->els_num + 1;
          if (pVVar2->size < uVar15) {
            sVar17 = (uVar15 >> 1) + uVar15;
            pMVar13 = (MIR_var_t *)realloc(pVVar2->varr,sVar17 * 0x18);
            pVVar2->varr = pMVar13;
            pVVar2->size = sVar17;
          }
          sVar17 = pVVar2->els_num;
          pMVar13 = pVVar2->varr;
          pVVar2->els_num = sVar17 + 1;
          pMVar13[sVar17].type = MVar7;
          pMVar13[sVar17].name = pcVar16;
          pMVar13[sVar17].size = (size_t)pcVar12;
          pnVar18 = (pnVar18->op_link).next;
          pcVar12 = local_38;
        } while (pnVar18 != (node_t)0x0);
      }
      return;
    }
    uVar5 = process_ret_type(c2m_ctx,(type *)func_type,local_40);
    if (uVar5 != 0) {
      if (0 < (int)uVar5) {
        uVar15 = 0;
        do {
          func_type = (func_type *)0x5;
          MVar7 = local_40[uVar15];
          MVar6 = MVar7 & ~MIR_T_I16;
          if (MVar6 == MIR_T_U8) {
            MVar7 = MIR_T_U32;
          }
          if (MVar6 == MIR_T_I8) {
            MVar7 = MIR_T_I32;
          }
          c2m_ctx = (c2m_ctx_t)pVVar3->varr;
          if (c2m_ctx == (c2m_ctx_t)0x0) {
            collect_args_and_func_types_cold_1();
            goto LAB_0019ca19;
          }
          uVar8 = pVVar3->els_num + 1;
          if (pVVar3->size < uVar8) {
            sVar17 = (uVar8 >> 1) + uVar8;
            pMVar9 = (MIR_type_t *)realloc(c2m_ctx,sVar17 * 4);
            pVVar3->varr = pMVar9;
            pVVar3->size = sVar17;
            pcVar12 = local_38;
          }
          sVar17 = pVVar3->els_num;
          pVVar3->els_num = sVar17 + 1;
          pVVar3->varr[sVar17] = MVar7;
          uVar15 = uVar15 + 1;
        } while (uVar5 != uVar15);
      }
      goto LAB_0019c865;
    }
    if ((((type *)func_type)->mode & ~TM_BASIC) != TM_STRUCT) {
      MVar7 = get_mir_type(c2m_ctx,(type *)func_type);
      c2m_ctx_00 = (c2m_ctx_t)pVVar3->varr;
      if (c2m_ctx_00 != (c2m_ctx_t)0x0) {
        uVar15 = pVVar3->els_num + 1;
        if (pVVar3->size < uVar15) {
          sVar17 = (uVar15 >> 1) + uVar15;
          pMVar9 = (MIR_type_t *)realloc(c2m_ctx_00,sVar17 * 4);
          pVVar3->varr = pMVar9;
          pVVar3->size = sVar17;
        }
        sVar17 = pVVar3->els_num;
        pVVar3->els_num = sVar17 + 1;
        pVVar3->varr[sVar17] = MVar7;
        goto LAB_0019c865;
      }
      goto LAB_0019ca28;
    }
    ptVar14 = (type *)func_type;
    mVar10 = raw_type_size(c2m_ctx,(type *)func_type);
    uVar15 = (ulong)((type *)func_type)->align;
    if (uVar15 != 0) {
      uVar8 = (mVar10 - 1) + uVar15;
      mVar10 = uVar8 - uVar8 % uVar15;
    }
    c2m_ctx_00 = (c2m_ctx_t)pVVar2->varr;
    func_type = (func_type *)ptVar14;
    if (c2m_ctx_00 != (c2m_ctx_t)0x0) {
      uVar15 = pVVar2->els_num + 1;
      if (pVVar2->size < uVar15) {
        sVar17 = (uVar15 >> 1) + uVar15;
        pMVar13 = (MIR_var_t *)realloc(c2m_ctx_00,sVar17 * 0x18);
        pVVar2->varr = pMVar13;
        pVVar2->size = sVar17;
      }
      sVar17 = pVVar2->els_num;
      pMVar13 = pVVar2->varr;
      pVVar2->els_num = sVar17 + 1;
      pMVar13[sVar17].type = MIR_T_RBLK;
      pMVar13[sVar17].name = "Ret_Addr";
      pMVar13[sVar17].size = mVar10;
      local_50.n_iregs = 1;
      goto LAB_0019c865;
    }
  }
  collect_args_and_func_types_cold_3();
LAB_0019ca28:
  collect_args_and_func_types_cold_2();
  if (c2m_ctx_00 != (c2m_ctx_t)0x0) {
    return;
  }
  VARR_MIR_var_taddr_cold_1();
  if (c2m_ctx_00 == (c2m_ctx_t)0x0) {
    VARR_MIR_var_tlength_cold_1();
    MVar7 = MIR_T_I64;
    if ((((type *)func_type)->mode & ~TM_BASIC) != TM_STRUCT) {
      MVar7 = get_mir_type(c2m_ctx_00,(type *)func_type);
    }
    MVar6 = MIR_T_U32;
    if ((MVar7 & 0x1d) != MIR_T_U8) {
      MVar6 = MVar7;
    }
    promoted_type = MIR_T_I32;
    if ((MVar7 & 0x1d) != MIR_T_I8) {
      promoted_type = MVar6;
    }
    get_reg_var_name(c2m_ctx_00,promoted_type,suffix,0);
    return;
  }
  return;
}

Assistant:

static void collect_args_and_func_types (c2m_ctx_t c2m_ctx, struct func_type *func_type) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  node_t declarator, id, first_param, p;
  struct type *param_type;
  decl_t param_decl;
  const char *name;
  target_arg_info_t arg_info;

  first_param = NL_HEAD (func_type->param_list->u.ops);
  VARR_TRUNC (MIR_var_t, proto_info.arg_vars, 0);
  VARR_TRUNC (MIR_type_t, proto_info.ret_types, 0);
  proto_info.res_ref_p = FALSE;
  target_init_arg_vars (c2m_ctx, &arg_info);
  set_type_layout (c2m_ctx, func_type->ret_type);
  target_add_res_proto (c2m_ctx, func_type->ret_type, &arg_info, proto_info.ret_types,
                        proto_info.arg_vars);
  if (first_param != NULL && !void_param_p (first_param)) {
    for (p = first_param; p != NULL; p = NL_NEXT (p)) {
      if (p->code == N_TYPE) {
        name = "p";
        param_type = ((struct decl_spec *) p->attr)->type;
        param_decl = NULL;
      } else {
        declarator = NL_EL (p->u.ops, 1);
        assert (p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL);
        id = NL_HEAD (declarator->u.ops);
        param_decl = p->attr;
        param_type = param_decl->decl_spec.type;
        name = get_param_name (c2m_ctx, param_type, id->u.s.s);
      }
      target_add_arg_proto (c2m_ctx, name, param_type, &arg_info, proto_info.arg_vars);
    }
  }
}